

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

void lz77_advance(LZ77InternalContext *st,uchar c,int hash)

{
  short sVar1;
  int iVar2;
  long lVar3;
  WindowEntry *pWVar4;
  
  iVar2 = st->winpos;
  lVar3 = (long)st->win[iVar2].prev;
  if (lVar3 == -1) {
    lVar3 = (long)st->win[iVar2].hashval;
    if (lVar3 == -1) goto LAB_0012f98a;
    pWVar4 = (WindowEntry *)(st->hashtab + lVar3);
  }
  else {
    pWVar4 = st->win + lVar3;
  }
  pWVar4->next = -1;
LAB_0012f98a:
  st->win[iVar2].hashval = (short)hash;
  st->win[iVar2].prev = -1;
  sVar1 = st->hashtab[(uint)hash].first;
  st->win[iVar2].next = sVar1;
  st->hashtab[(uint)hash].first = (short)iVar2;
  if ((long)sVar1 != -1) {
    st->win[sVar1].prev = (short)iVar2;
  }
  st->data[iVar2] = c;
  st->winpos = st->winpos + 1U & 0x7fff;
  return;
}

Assistant:

static void lz77_advance(struct LZ77InternalContext *st,
                         unsigned char c, int hash)
{
    int off;

    /*
     * Remove the hash entry at winpos from the tail of its chain,
     * or empty the chain if it's the only thing on the chain.
     */
    if (st->win[st->winpos].prev != INVALID) {
        st->win[st->win[st->winpos].prev].next = INVALID;
    } else if (st->win[st->winpos].hashval != INVALID) {
        st->hashtab[st->win[st->winpos].hashval].first = INVALID;
    }

    /*
     * Create a new entry at winpos and add it to the head of its
     * hash chain.
     */
    st->win[st->winpos].hashval = hash;
    st->win[st->winpos].prev = INVALID;
    off = st->win[st->winpos].next = st->hashtab[hash].first;
    st->hashtab[hash].first = st->winpos;
    if (off != INVALID)
        st->win[off].prev = st->winpos;
    st->data[st->winpos] = c;

    /*
     * Advance the window pointer.
     */
    st->winpos = (st->winpos + 1) & (WINSIZE - 1);
}